

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_websocket.c
# Opt level: O1

void test_close_self_sendframe_fails(void)

{
  cio_error cVar1;
  
  cio_buffered_stream_write_fake.custom_fake = bs_write_error;
  cVar1 = cio_websocket_close(ws,CIO_WEBSOCKET_CLOSE_NORMAL,"Going away",close_handler,(void *)0x0);
  UnityAssertEqualNumber(0,(long)cVar1,"Close not failed correctly",0x38b,UNITY_DISPLAY_STYLE_INT);
  UnityAssertEqualNumber
            (1,(ulong)on_error_fake.call_count,"error callback was not called",0x38d,
             UNITY_DISPLAY_STYLE_INT);
  UnityAssertEqualNumber
            ((UNITY_INT)ws,(UNITY_INT)on_error_fake.arg0_val,
             "websocket parameter of error handler not correct",0x38e,UNITY_DISPLAY_STYLE_INT);
  UnityAssertEqualNumber
            (-0x5a,(long)on_error_fake.arg1_val,"error code in error handler not correct",0x38f,
             UNITY_DISPLAY_STYLE_INT);
  return;
}

Assistant:

static void test_close_self_sendframe_fails(void)
{
	cio_buffered_stream_write_fake.custom_fake = bs_write_error;

	enum cio_error err = cio_websocket_close(ws, CIO_WEBSOCKET_CLOSE_NORMAL, "Going away", close_handler, NULL);
	TEST_ASSERT_EQUAL_MESSAGE(CIO_SUCCESS, err, "Close not failed correctly");

	TEST_ASSERT_EQUAL_MESSAGE(1, on_error_fake.call_count, "error callback was not called");
	TEST_ASSERT_EQUAL_MESSAGE(ws, on_error_fake.arg0_val, "websocket parameter of error handler not correct");
	TEST_ASSERT_EQUAL_MESSAGE(CIO_MESSAGE_TOO_LONG, on_error_fake.arg1_val, "error code in error handler not correct");
}